

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmailClientSendInBlue.cpp
# Opt level: O0

ssize_t __thiscall
EmailClientSendInBlue::send(EmailClientSendInBlue *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ostream *poVar1;
  element_type *peVar2;
  undefined8 extraout_RAX;
  string_view content;
  system_error *e;
  undefined1 local_2a0 [16];
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  r2;
  undefined1 local_220 [8];
  CaseInsensitiveMultimap header;
  string body;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [8];
  Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> client;
  EmailClientSendInBlue *this_local;
  
  client.context.init_.ref_.
  super___shared_ptr<asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__cxx11::string::string((string *)&local_178);
  std::__cxx11::string::string((string *)&local_198);
  std::__cxx11::string::string((string *)&local_1b8);
  SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Client
            ((Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *)local_158,
             &this->url_,true,&local_178,&local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump((string_t *)&header._M_h._M_single_bucket,&this->body_,-1,' ',false,strict);
  poVar1 = std::operator<<((ostream *)&std::cout,"Send email request: ");
  poVar1 = std::operator<<(poVar1,(string *)&header._M_h._M_single_bucket);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_220);
  std::
  unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::emplace<char_const(&)[13],char_const(&)[17]>
            ((unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_220,(char (*) [13])"Content-Type",(char (*) [17])"application/json");
  r2.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
       ::emplace<char_const(&)[8],std::__cxx11::string_const&>
                 ((unordered_multimap<std::__cxx11::string,std::__cxx11::string,SimpleWeb::CaseInsensitiveHash,SimpleWeb::CaseInsensitiveEqual,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)local_220,(char (*) [8])"api-key",&this->apiKey_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"POST",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"/v3/smtp/email",&local_289);
  local_2a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&header._M_h._M_single_bucket);
  content._M_str = local_2a0._0_8_;
  content._M_len = (size_t)local_288;
  SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::request
            ((ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *)local_240,
             (string *)local_158,&local_260,content,local_2a0._8_8_);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  poVar1 = std::operator<<((ostream *)&std::cout,"Response:");
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_240);
  SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Content::
  string_abi_cxx11_((string *)&e,(Content *)&peVar2->content);
  poVar1 = std::operator<<(poVar1,(string *)&e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&e);
  std::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  ::~shared_ptr((shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
                 *)local_240);
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_220);
  std::__cxx11::string::~string((string *)&header._M_h._M_single_bucket);
  SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::~Client
            ((Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *)local_158);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool EmailClientSendInBlue::send()
{
    SimpleWeb::Client<SimpleWeb::HTTPS> client(url_, true);

    // Synchronous request examples
    std::string body = body_.dump();

    std::cout << "Send email request: " << body << std::endl;

    try {
        SimpleWeb::CaseInsensitiveMultimap header;
        header.emplace("Content-Type", "application/json");
        header.emplace("api-key", apiKey_ );

        auto r2 = client.request("POST", "/v3/smtp/email", body, header);
        std::cout << "Response:" << r2->content.string() << std::endl;
    }
    catch(const SimpleWeb::system_error &e) {
        std::cerr << "Client request error: " << e.what() << std::endl;
        return false;
    }

    return true;
}